

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  uint uVar1;
  
  uVar1 = SortEdgesIntoEdgeChains(unsorted_edges,minimum_chain_length,sorted_edges,false);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDEdgePtr >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  // Dale Lear - June 20 2023 https://mcneel.myjetbrains.com/youtrack/issue/RH-75228
  // To avoid breaking the the 7.x SDK 
  // Call Mikko's modified version. https://mcneel.myjetbrains.com/youtrack/issue/RH-66258
  // It is extremely unlikely anybody outside of core McNeel devs ever called the original function.
  const bool bIgnoreCorners = false;
  return ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
    unsorted_edges,
    minimum_chain_length,
    sorted_edges,
    bIgnoreCorners
  );
}